

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O1

SQInteger __thiscall
SQVM::FallBackGet(SQVM *this,SQObjectPtr *self,SQObjectPtr *key,SQObjectPtr *dest)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  bool bVar4;
  int iVar5;
  SQObjectPtr closure;
  SQObjectPtr local_38;
  
  SVar2 = (self->super_SQObject)._type;
  if (SVar2 != OT_TABLE) {
    if (SVar2 == OT_INSTANCE) goto LAB_0012fd94;
    if (SVar2 != OT_USERDATA) {
      return 1;
    }
  }
  local_38.super_SQObject._unVal = (SQObjectValue)((self->super_SQObject)._unVal.pClosure)->_env;
  if (local_38.super_SQObject._unVal.pTable == (SQTable *)0x0) {
    return 1;
  }
  local_38.super_SQObject._type = OT_TABLE;
  pSVar1 = &((local_38.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  bVar4 = Get(this,&local_38,key,dest,0,0x29a);
  SQObjectPtr::~SQObjectPtr(&local_38);
  if (bVar4) {
    return 0;
  }
LAB_0012fd94:
  local_38.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_38.super_SQObject._type = OT_NULL;
  pSVar3 = (self->super_SQObject)._unVal.pTable;
  iVar5 = (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[6]
          )(pSVar3,this,7);
  if ((char)iVar5 == '\0') {
    bVar4 = true;
  }
  else {
    Push(this,self);
    Push(this,key);
    this->_nmetamethodscall = this->_nmetamethodscall + 1;
    bVar4 = Call(this,&local_38,2,this->_top + -2,dest,0);
    if (bVar4) {
      Pop(this,2);
      dest = (SQObjectPtr *)0x0;
      bVar4 = false;
    }
    else {
      dest = (SQObjectPtr *)0x2;
      Pop(this,2);
      bVar4 = (this->_lasterror).super_SQObject._type == OT_NULL;
    }
    this->_nmetamethodscall = this->_nmetamethodscall + -1;
  }
  SQObjectPtr::~SQObjectPtr(&local_38);
  if (bVar4) {
    return 1;
  }
  return (SQInteger)dest;
}

Assistant:

SQInteger SQVM::FallBackGet(const SQObjectPtr &self,const SQObjectPtr &key,SQObjectPtr &dest)
{
    switch(type(self)){
    case OT_TABLE:
    case OT_USERDATA:
        //delegation
        if(_delegable(self)->_delegate) {
            if(Get(SQObjectPtr(_delegable(self)->_delegate),key,dest,0,DONT_FALL_BACK)) return FALLBACK_OK;
        }
        else {
            return FALLBACK_NO_MATCH;
        }
        //go through
    case OT_INSTANCE: {
        SQObjectPtr closure;
        if(_delegable(self)->GetMetaMethod(this, MT_GET, closure)) {
            Push(self);Push(key);
            _nmetamethodscall++;
            AutoDec ad(&_nmetamethodscall);
            if(Call(closure, 2, _top - 2, dest, SQFalse)) {
                Pop(2);
                return FALLBACK_OK;
            }
            else {
                Pop(2);
                if(type(_lasterror) != OT_NULL) { //NULL means "clean failure" (not found)
                    return FALLBACK_ERROR;
                }
            }
        }
                      }
        break;
    default: break;//shutup GCC 4.x
    }
    // no metamethod or no fallback type
    return FALLBACK_NO_MATCH;
}